

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b780::Encode_FromString_Test::TestBody(Encode_FromString_Test *this)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  __tuple_element_t<0UL,_tuple<optional<vector<unsigned_char,_allocator<unsigned_char>_>_>,_optional<basic_string<char>_>_>_>
  *success;
  Message *pMVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  char *pcVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *rhs;
  char *in_R9;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  string local_150;
  AssertHelper local_130;
  Message local_128;
  bool local_119;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_;
  type *optErr;
  type *optEncoded;
  ResBytes local_d8;
  allocator<unsigned_char> local_89;
  uchar local_88 [24];
  iterator local_70;
  size_type local_68;
  undefined1 local_60 [8];
  Bytes expected;
  allocator<char> local_31;
  string local_30 [8];
  string hash;
  Encode_FromString_Test *this_local;
  
  hash.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"8a173fd3e32c0fa78b90fe42d305f202244e2739",&local_31);
  std::allocator<char>::~allocator(&local_31);
  local_88[0x10] = 0xf2;
  local_88[0x11] = '\x02';
  local_88[0x12] = '$';
  local_88[0x13] = 'N';
  local_88[0x14] = '\'';
  local_88[0x15] = '9';
  local_88[0] = '\x11';
  local_88[1] = '\x14';
  local_88[2] = 0x8a;
  local_88[3] = '\x17';
  local_88[4] = '?';
  local_88[5] = 0xd3;
  local_88[6] = 0xe3;
  local_88[7] = ',';
  local_88[8] = '\x0f';
  local_88[9] = 0xa7;
  local_88[10] = 0x8b;
  local_88[0xb] = 0x90;
  local_88[0xc] = 0xfe;
  local_88[0xd] = 'B';
  local_88[0xe] = 0xd3;
  local_88[0xf] = '\x05';
  local_70 = local_88;
  local_68 = 0x16;
  std::allocator<unsigned_char>::allocator(&local_89);
  __l._M_len = local_68;
  __l._M_array = local_70;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,__l,&local_89);
  std::allocator<unsigned_char>::~allocator(&local_89);
  std::__cxx11::string::string((string *)&optEncoded,local_30);
  multihash::encode(&local_d8,(string *)&optEncoded,0x11);
  std::__cxx11::string::~string((string *)&optEncoded);
  success = std::
            get<0ul,std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::optional<std::__cxx11::string>>
                      (&local_d8);
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       get<1ul,std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::optional<std::__cxx11::string>>
                 (&local_d8);
  local_119 = std::optional::operator_cast_to_bool((optional *)gtest_ar_.message_.ptr_);
  local_119 = !local_119;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_118,&local_119,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pMVar2 = testing::Message::operator<<(&local_128,(char (*) [28])"Expected no error. error: \'");
    val = std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::value(gtest_ar_.message_.ptr_);
    pMVar2 = testing::Message::operator<<(pMVar2,val);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [2])0x160304);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_150,(internal *)local_118,(AssertionResult *)"optErr","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
               ,0xc1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_130,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    testing::Message::~Message(&local_128);
  }
  gtest_ar__1.message_.ptr_._5_3_ = 0;
  gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
    testing::AssertionResult::
    AssertionResult<std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((AssertionResult *)local_168,success,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
    if (!bVar1) {
      testing::Message::Message(&local_170);
      pMVar2 = testing::Message::operator<<
                         (&local_170,(char (*) [40])"An encoded multihash should be returned");
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_168,(AssertionResult *)"optEncoded",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                 ,0xc2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_178,pMVar2);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_170);
    }
    gtest_ar__1.message_.ptr_._5_3_ = 0;
    gtest_ar__1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
    if (gtest_ar__1.message_.ptr_._4_4_ == 0) {
      rhs = std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::value
                      (success);
      testing::internal::EqHelper<false>::
      Compare<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((EqHelper<false> *)local_1a8,"expected","optEncoded.value()",
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60,rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
      if (!bVar1) {
        testing::Message::Message(&local_1b0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dgellow[P]multihash/tests/multihash_test.cpp"
                   ,0xc4,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_1b8);
        testing::Message::~Message(&local_1b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
      gtest_ar__1.message_.ptr_._4_4_ = 0;
    }
  }
  std::
  tuple<std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~tuple(&local_d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_60);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Encode, FromString) {
	std::string hash = "8a173fd3e32c0fa78b90fe42d305f202244e2739";
	multihash::Bytes expected{
	    0x11, 0x14, 0x8a, 0x17, 0x3f, 0xd3, 0xe3, 0x2c, 0x0f, 0xa7, 0x8b,
	    0x90, 0xfe, 0x42, 0xd3, 0x05, 0xf2, 0x02, 0x24, 0x4e, 0x27, 0x39,
	};

	auto [optEncoded, optErr] = multihash::encode(hash, 0x11);
	ASSERT_FALSE(optErr) << "Expected no error. error: '" << optErr.value() << "'";
	ASSERT_TRUE(optEncoded) << "An encoded multihash should be returned";

	EXPECT_EQ(expected, optEncoded.value());
}